

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcommand_a.cpp
# Opt level: O0

void setup_subcommand_a(App *app)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  App *pAVar1;
  element_type *peVar2;
  Option *this_00;
  anon_class_16_1_ba1d6a13 local_158;
  function<void_()> local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  App *local_28;
  App *sub;
  shared_ptr<SubcommandAOptions> opt;
  App *app_local;
  
  opt.super___shared_ptr<SubcommandAOptions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)app;
  CLI::std::make_shared<SubcommandAOptions>();
  this._M_pi = opt.super___shared_ptr<SubcommandAOptions,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"subcommand_a",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"performs subcommand a",&local_81);
  pAVar1 = CLI::App::add_subcommand((App *)this._M_pi,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_28 = pAVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"-f,--file",&local_a9);
  peVar2 = CLI::std::
           __shared_ptr_access<SubcommandAOptions,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SubcommandAOptions,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&sub);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"File name",&local_d1);
  this_00 = CLI::App::
            add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                      (pAVar1,&local_a8,&peVar2->file,&local_d0);
  CLI::OptionBase<CLI::Option>::required(&this_00->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  pAVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"--with-foo",&local_f9);
  peVar2 = CLI::std::
           __shared_ptr_access<SubcommandAOptions,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SubcommandAOptions,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&sub);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"Counter",&local_121);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar1,&local_f8,&peVar2->with_foo,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  pAVar1 = local_28;
  CLI::std::shared_ptr<SubcommandAOptions>::shared_ptr
            (&local_158.opt,(shared_ptr<SubcommandAOptions> *)&sub);
  std::function<void()>::function<setup_subcommand_a(CLI::App&)::__0,void>
            ((function<void()> *)&local_148,&local_158);
  CLI::App::set_callback(pAVar1,&local_148);
  CLI::std::function<void_()>::~function(&local_148);
  setup_subcommand_a(CLI::App&)::$_0::~__0((__0 *)&local_158);
  CLI::std::shared_ptr<SubcommandAOptions>::~shared_ptr((shared_ptr<SubcommandAOptions> *)&sub);
  return;
}

Assistant:

void setup_subcommand_a(CLI::App &app) {
    // Create the option and subcommand objects.
    auto opt = std::make_shared<SubcommandAOptions>();
    auto sub = app.add_subcommand("subcommand_a", "performs subcommand a");

    // Add options to sub, binding them to opt.
    sub->add_option("-f,--file", opt->file, "File name")->required();
    sub->add_flag("--with-foo", opt->with_foo, "Counter");

    // Set the run function as callback to be called when this subcommand is issued.
    sub->set_callback([opt]() { run_subcommand_a(*opt); });
}